

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void inithess_lower(double *L,int N,double fi,double fsval,double *dx)

{
  double dVar1;
  double local_48;
  double temp;
  int local_38;
  int ct;
  int j;
  int i;
  double *dx_local;
  double fsval_local;
  double fi_local;
  int N_local;
  double *L_local;
  
  local_48 = fsval;
  if (fsval < ABS(fi)) {
    local_48 = ABS(fi);
  }
  dVar1 = sqrt(local_48);
  for (ct = 0; ct < N; ct = ct + 1) {
    L[ct * N + ct] = dVar1 * dx[ct];
    for (local_38 = 0; local_38 < ct; local_38 = local_38 + 1) {
      L[ct * N + local_38] = 0.0;
    }
  }
  return;
}

Assistant:

static void inithess_lower(double *L,int N,double fi,double fsval,double *dx) {
	int i,j,ct;
	double temp;
	
	if (fabs(fi) > fsval) {
		temp = fabs(fi);
	} else {
		temp = fsval;
	}
	
	temp = sqrt(temp);
	
	for(i = 0; i < N;++i) {
		ct = i *N;
		L[ct+i] = temp * dx[i];
		for(j = 0; j < i;++j) {
			L[ct+j] = 0;
		}
	}
	
}